

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UBool __thiscall
icu_63::anon_unknown_16::PartLevelCallback::needToWrite(PartLevelCallback *this,Level l)

{
  UBool UVar1;
  int32_t iVar2;
  Level l_local;
  PartLevelCallback *this_local;
  
  UVar1 = SortKeyByteSink::Overflowed(this->sink);
  if (UVar1 == '\0') {
    this->level = l;
    iVar2 = SortKeyByteSink::GetRemainingCapacity(this->sink);
    this->levelCapacity = iVar2;
  }
  return UVar1 == '\0';
}

Assistant:

virtual UBool needToWrite(Collation::Level l) {
        if(!sink.Overflowed()) {
            // Remember a level that will be at least partially written.
            level = l;
            levelCapacity = sink.GetRemainingCapacity();
            return TRUE;
        } else {
            return FALSE;
        }
    }